

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane(IfcCurveBoundedPlane *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcBoundedSurface.field_0x50 = &PTR__IfcCurveBoundedPlane_00970560
  ;
  *(undefined ***)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x38 =
       &PTR__IfcCurveBoundedPlane_00970628;
  this[-1].InnerBoundaries.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__IfcCurveBoundedPlane_00970588;
  this[-1].InnerBoundaries.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__IfcCurveBoundedPlane_009705b0;
  *(undefined ***)&this[-1].field_0x80 = &PTR__IfcCurveBoundedPlane_009705d8;
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCurveBoundedPlane_00970600;
  pvVar1 = *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x20;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcBoundedSurface).super_IfcSurface.
                                     super_IfcGeometricRepresentationItem.field_0x30 - (long)pvVar1)
    ;
  }
  operator_delete(&this[-1].super_IfcBoundedSurface.field_0x50,0x90);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}